

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.h
# Opt level: O3

void __thiscall chrono::fea::ChElementBeamEuler::GetSubBlockOffset(ChElementBeamEuler *this)

{
  return;
}

Assistant:

virtual unsigned int GetSubBlockOffset(int nblock) override { return nodes[nblock]->NodeGetOffset_w(); }